

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem
          (string *__return_storage_ptr__,FeatureDescriptor *this,string *library,string *libItem,
          string *linkItem,ItemIsPath isPath)

{
  string *psVar1;
  string *local_a8;
  undefined1 local_78 [8];
  FeaturePlaceHolderExpander expander;
  string format;
  ItemIsPath isPath_local;
  string *linkItem_local;
  string *libItem_local;
  string *library_local;
  FeatureDescriptor *this_local;
  
  if (isPath == Yes) {
    local_a8 = (string *)&this->ItemPathFormat;
  }
  else {
    local_a8 = (string *)&this->ItemNameFormat;
  }
  std::__cxx11::string::string((string *)&expander.LinkItem,local_a8);
  anon_unknown.dwarf_fea82c::FeaturePlaceHolderExpander::FeaturePlaceHolderExpander
            ((FeaturePlaceHolderExpander *)local_78,library,libItem,linkItem);
  psVar1 = cmPlaceholderExpander::ExpandVariables
                     ((cmPlaceholderExpander *)local_78,(string *)&expander.LinkItem);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  anon_unknown.dwarf_fea82c::FeaturePlaceHolderExpander::~FeaturePlaceHolderExpander
            ((FeaturePlaceHolderExpander *)local_78);
  std::__cxx11::string::~string((string *)&expander.LinkItem);
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem(
  std::string const& library, std::string const& libItem,
  std::string const& linkItem, ItemIsPath isPath) const
{
  auto format =
    isPath == ItemIsPath::Yes ? this->ItemPathFormat : this->ItemNameFormat;

  // replace <LIBRARY>, <LIB_ITEM> and <LINK_ITEM> patterns
  FeaturePlaceHolderExpander expander(&library, &libItem, &linkItem);
  return expander.ExpandVariables(format);
}